

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::Context::clearFilters(Context *this)

{
  vector<doctest::String,_std::allocator<doctest::String>_> *pvVar1;
  vector<doctest::String,_std::allocator<doctest::String>_> *curr;
  vector<doctest::String,_std::allocator<doctest::String>_> *this_00;
  
  pvVar1 = (this->p->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->p->filters).
                 super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pvVar1; this_00 = this_00 + 1
      ) {
    std::vector<doctest::String,_std::allocator<doctest::String>_>::_M_erase_at_end
              (this_00,(this_00->
                       super__Vector_base<doctest::String,_std::allocator<doctest::String>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Context::clearFilters() {
    for(auto& curr : p->filters)
        curr.clear();
}